

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direction.hh
# Opt level: O0

void __thiscall Direction::Direction(Direction *this,int i,int j)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char local_e8 [8];
  char str [200];
  int j_local;
  int i_local;
  Direction *this_local;
  
  this->i = i;
  this->j = j;
  iVar1 = i;
  if (i < 1) {
    iVar1 = -i;
  }
  iVar3 = j;
  if (j < 1) {
    iVar3 = -j;
  }
  bVar2 = between<int>(iVar1 + iVar3,0,1);
  if (!bVar2) {
    sprintf(local_e8,"Incorrect direction %d %d",(ulong)(uint)i,(ulong)(uint)j);
    poVar4 = std::operator<<((ostream *)&std::cout,"Error[");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/agents/../state/direction.hh"
                            );
    poVar4 = std::operator<<(poVar4,"][");
    poVar4 = std::operator<<(poVar4,"Direction");
    poVar4 = std::operator<<(poVar4,"][Line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x11);
    poVar4 = std::operator<<(poVar4,"] ");
    poVar4 = std::operator<<(poVar4,local_e8);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  return;
}

Assistant:

Direction(int i, int j) : i(i), j(j) {
        ensure(between(abs(i) + abs(j), 0, 1), "Incorrect direction %d %d", i, j);
    }